

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenize.c
# Opt level: O2

int get_one_number(dmr_C *C,int c,int next,stream_t *stream)

{
  tokenizer_state_t *ptVar1;
  ulong uVar2;
  token *ptVar3;
  position pos;
  char *__dest;
  long lVar4;
  char *pcVar5;
  long lVar6;
  
  ptVar1 = C->T;
  ptVar1->number_buffer[0] = (char)c;
  lVar4 = 0xeceb;
  while( true ) {
    pcVar5 = ptVar1->special + lVar4 + -0x14;
    uVar2 = C->T->cclass[next + 1];
    if ((uVar2 & 0x13) == 0) break;
    lVar6 = 0xfce9;
    if (lVar4 != 0xfce9) {
      lVar6 = lVar4 + 1;
      *pcVar5 = (char)next;
    }
    next = nextchar(C,stream);
    lVar4 = lVar6;
    if (((uVar2 & 8) != 0) && ((next == 0x2d || (next == 0x2b)))) {
      lVar4 = 0xfce9;
      if (lVar6 != 0xfce9) {
        ptVar1->special[lVar6 + -0x14] = (char)next;
        lVar4 = lVar6 + 1;
      }
      next = nextchar(C,stream);
    }
  }
  if (lVar4 == 0xfce9) {
    pcVar5 = ptVar1->number_buffer + 1;
    pos = stream_pos(stream);
    dmrC_sparse_error(C,pos,"number token exceeds %td characters",0xfff);
    ptVar1->number_buffer[0] = '1';
  }
  *pcVar5 = '\0';
  __dest = (char *)dmrC_allocator_allocate
                             (&C->byte_allocator,
                              (size_t)(pcVar5 + (1 - (long)ptVar1->number_buffer)));
  memcpy(__dest,ptVar1->number_buffer,(size_t)(pcVar5 + (1 - (long)ptVar1->number_buffer)));
  ptVar3 = stream->token;
  ptVar3->pos = (position)((ulong)ptVar3->pos & 0xffffffffffffffc0 | 4);
  (ptVar3->field_2).number = __dest;
  ptVar3 = stream->token;
  stream->token = (token *)0x0;
  ptVar3->next = (token *)0x0;
  *stream->tokenlist = ptVar3;
  stream->tokenlist = &ptVar3->next;
  return next;
}

Assistant:

static int get_one_number(struct dmr_C *C, int c, int next, stream_t *stream)
{
	struct token *token;
	char *buffer = C->T->number_buffer;
	char *p = buffer, *buf, *buffer_end = buffer + sizeof C->T->number_buffer;
	size_t len;

	*p++ = c;
	for (;;) {
		long kclass = C->T->cclass[next + 1];
		if (!(kclass & (Dot | Digit | Letter)))
			break;
		if (p != buffer_end)
			*p++ = next;
		next = nextchar(C, stream);
		if (kclass & Exp) {
			if (next == '-' || next == '+') {
				if (p != buffer_end)
					*p++ = next;
				next = nextchar(C, stream);
			}
		}
	}

	if (p == buffer_end) {
		dmrC_sparse_error(C, stream_pos(stream),
			     "number token exceeds %td characters",
			     buffer_end - buffer);
		// Pretend we saw just "1".
		buffer[0] = '1';
		p = buffer + 1;
	}

	*p++ = 0;
	len = p - buffer;
	buf = (char *)dmrC_allocator_allocate(&C->byte_allocator, len);
	memcpy(buf, buffer, len);

	token = stream->token;
	dmrC_token_type(token) = TOKEN_NUMBER;
	token->number = buf;
	add_token(stream);

	return next;
}